

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_address.cpp
# Opt level: O0

DescriptorScriptData * __thiscall
cfd::api::AddressApi::ParseOutputDescriptor
          (AddressApi *this,string *descriptor,NetType net_type,string *bip32_derivation_path,
          vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *script_list
          ,vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>
           *multisig_key_list,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *prefix_list,vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  bool bVar1;
  uint32_t uVar2;
  DescriptorScriptType DVar3;
  AddressType AVar4;
  uint uVar5;
  DescriptorKeyType DVar6;
  reference pvVar7;
  reference pvVar8;
  reference this_00;
  NetType in_ECX;
  string *in_RDX;
  DescriptorScriptData *in_RDI;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *in_stack_00000018;
  DescriptorKeyData key_data;
  DescriptorKeyReference *ref_1;
  iterator __end3_2;
  iterator __begin3_2;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  *__range3_2;
  DescriptorScriptData data;
  DescriptorScriptReference child;
  uint32_t depth;
  bool is_loop;
  DescriptorScriptReference script_ref;
  DescriptorScriptData ref_data;
  DescriptorScriptReference *ref;
  iterator __end3_1;
  iterator __begin3_1;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  *__range3_1;
  DescriptorKeyReference key_ref;
  bool use_script_list;
  uint32_t multisig_req_num;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  multisig_keys;
  DescriptorNode node;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  script_refs;
  KeyData *key;
  iterator __end3;
  iterator __begin3;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__range3;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> temp_list;
  uint32_t index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  Descriptor desc;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> addr_prefixes;
  DescriptorScriptData *result;
  DescriptorKeyType in_stack_ffffffffffffdd80;
  undefined4 in_stack_ffffffffffffdd84;
  value_type *in_stack_ffffffffffffdd88;
  undefined4 in_stack_ffffffffffffdd90;
  DescriptorKeyType in_stack_ffffffffffffdd94;
  DescriptorScriptData *in_stack_ffffffffffffddb0;
  DescriptorScriptData *this_01;
  __normal_iterator<cfd::core::DescriptorKeyReference_*,_std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>_>
  local_21a8;
  __normal_iterator<cfd::core::DescriptorKeyReference_*,_std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>_>
  local_21a0;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  *local_2198;
  DescriptorKeyReference *in_stack_ffffffffffffdeb0;
  anon_class_1_0_00000001 *in_stack_ffffffffffffdeb8;
  string local_1e40 [32];
  undefined1 local_1e20 [600];
  undefined1 local_1bc8 [872];
  Script local_1860;
  DescriptorScriptType local_1828;
  Script local_1820;
  int local_17e8;
  Address local_17e0;
  AddressType local_1668;
  Script local_1660;
  DescriptorKeyType local_1628;
  string local_1620 [32];
  uint32_t local_1600;
  DescriptorScriptReference local_14f0;
  Script local_11a0;
  int local_1168;
  byte local_1161;
  DescriptorScriptReference local_1160;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_e10;
  string local_df8 [32];
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_dd8;
  string local_dc0 [32];
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_da0;
  Script local_d88;
  Address local_d50;
  Script local_bd8;
  DescriptorScriptType local_ba0;
  Script local_b98;
  undefined4 local_b60;
  Address local_b58;
  AddressType local_9e0;
  Script local_9d8;
  DescriptorKeyType local_9a0;
  string local_998 [304];
  DescriptorScriptReference *local_868;
  __normal_iterator<cfd::core::DescriptorScriptReference_*,_std::vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>_>
  local_860;
  __normal_iterator<cfd::core::DescriptorScriptReference_*,_std::vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>_>
  local_858;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  *local_850;
  DescriptorKeyReference local_848;
  byte local_5b5;
  uint32_t local_5b4;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_5b0;
  Script local_598;
  Address local_560;
  Script local_3e8;
  DescriptorNode local_3b0;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  local_248;
  reference local_230;
  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
  local_228;
  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
  local_220;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *local_218;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_210;
  uint local_1f4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  Descriptor local_1d8;
  byte local_6d;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_60;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_48;
  long local_30;
  NetType local_1c;
  string *local_18;
  
  this_01 = in_RDI;
  local_30 = in_R9;
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::vector
            (&local_48);
  if (in_stack_00000010 == 0) {
    core::GetBitcoinAddressFormatList();
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    operator=(&local_48,&local_60);
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90));
  }
  else {
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    operator=((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )this_01,(vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        *)in_RDI);
  }
  if (local_30 != 0) {
    std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::clear
              ((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
               0x549306);
  }
  if (in_stack_00000008 != 0) {
    std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::clear
              ((vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)0x54931e);
  }
  local_6d = 0;
  DescriptorScriptData::DescriptorScriptData(in_stack_ffffffffffffddb0);
  in_RDI->key_type = kDescriptorKeyNull;
  in_RDI->address_type = kP2shAddress;
  in_RDI->multisig_req_sig_num = 0;
  core::Descriptor::Parse(&local_1d8,local_18,&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x549387);
  for (local_1f4 = 0; uVar5 = local_1f4, uVar2 = core::Descriptor::GetNeedArgumentNum(&local_1d8),
      uVar5 < uVar2; local_1f4 = local_1f4 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90),
                (value_type *)in_stack_ffffffffffffdd88);
  }
  if (in_stack_00000018 != (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x0) {
    core::Descriptor::GetKeyDataAll(&local_210,&local_1d8,&local_1f0);
    local_218 = &local_210;
    local_220._M_current =
         (KeyData *)
         std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::begin(local_218);
    local_228._M_current =
         (KeyData *)
         std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::end(local_218);
    while (bVar1 = __gnu_cxx::operator!=(&local_220,&local_228), bVar1) {
      local_230 = __gnu_cxx::
                  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
                  ::operator*(&local_220);
      std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::push_back
                (in_stack_00000018,local_230);
      __gnu_cxx::
      __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
      ::operator++(&local_220);
    }
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
               CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90));
  }
  core::Descriptor::GetReferenceAll(&local_248,&local_1d8,&local_1f0);
  core::Descriptor::GetNode(&local_3b0,&local_1d8);
  DVar3 = core::DescriptorNode::GetScriptType(&local_3b0);
  in_RDI->type = DVar3;
  in_RDI->key_type = kDescriptorKeyNull;
  in_RDI->depth = 0;
  pvVar7 = std::
           vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           ::operator[](&local_248,0);
  core::DescriptorScriptReference::GetLockingScript(&local_3e8,pvVar7);
  core::Script::operator=(&in_RDI->locking_script,&local_3e8);
  core::Script::~Script((Script *)CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80));
  pvVar7 = std::
           vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           ::operator[](&local_248,0);
  bVar1 = core::DescriptorScriptReference::HasAddress(pvVar7);
  if (bVar1) {
    pvVar7 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[](&local_248,0);
    core::DescriptorScriptReference::GenerateAddress(&local_560,pvVar7,local_1c);
    core::Address::operator=(&in_RDI->address,&local_560);
    core::Address::~Address
              ((Address *)CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80));
    pvVar7 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[](&local_248,0);
    AVar4 = core::DescriptorScriptReference::GetAddressType(pvVar7);
    in_RDI->address_type = AVar4;
  }
  pvVar7 = std::
           vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           ::operator[](&local_248,0);
  bVar1 = core::DescriptorScriptReference::HasRedeemScript(pvVar7);
  if (bVar1) {
    pvVar7 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[](&local_248,0);
    core::DescriptorScriptReference::GetRedeemScript(&local_598,pvVar7);
    core::Script::operator=(&in_RDI->redeem_script,&local_598);
    core::Script::~Script((Script *)CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80));
  }
  std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ::vector(&local_5b0);
  local_5b4 = 0;
  local_5b5 = 0;
  core::DescriptorKeyReference::DescriptorKeyReference(&local_848);
  uVar5 = in_RDI->type - kDescriptorScriptSh;
  if (uVar5 < 9 || in_RDI->type == kDescriptorScriptRaw) {
    switch((long)&switchD_00549816::switchdataD_0085f928 +
           (long)(int)(&switchD_00549816::switchdataD_0085f928)[uVar5]) {
    case 0x549831:
      local_850 = &local_248;
      local_858._M_current =
           (DescriptorScriptReference *)
           std::
           vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           ::begin(local_850);
      local_860._M_current =
           (DescriptorScriptReference *)
           std::
           vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
           ::end(local_850);
      while (bVar1 = __gnu_cxx::operator!=(&local_858,&local_860), bVar1) {
        local_868 = __gnu_cxx::
                    __normal_iterator<cfd::core::DescriptorScriptReference_*,_std::vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>_>
                    ::operator*(&local_858);
        DescriptorScriptData::DescriptorScriptData(in_stack_ffffffffffffddb0);
        local_ba0 = core::DescriptorScriptReference::GetScriptType(local_868);
        local_b60 = 0;
        core::DescriptorScriptReference::GetLockingScript(&local_bd8,local_868);
        core::Script::operator=(&local_b98,&local_bd8);
        core::Script::~Script
                  ((Script *)CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80));
        bVar1 = core::DescriptorScriptReference::HasAddress(local_868);
        if (bVar1) {
          core::DescriptorScriptReference::GenerateAddress(&local_d50,local_868,local_1c);
          core::Address::operator=(&local_b58,&local_d50);
          core::Address::~Address
                    ((Address *)CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80));
          local_9e0 = core::DescriptorScriptReference::GetAddressType(local_868);
        }
        else {
          local_9e0 = kP2shAddress;
        }
        bVar1 = core::DescriptorScriptReference::HasRedeemScript(local_868);
        if (bVar1) {
          core::DescriptorScriptReference::GetRedeemScript(&local_d88,local_868);
          core::Script::operator=(&local_9d8,&local_d88);
          core::Script::~Script
                    ((Script *)CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80));
          local_9a0 = kDescriptorKeyNull;
        }
        else {
          core::DescriptorScriptReference::GetKeyList(&local_da0,local_868);
          pvVar8 = std::
                   vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   ::operator[](&local_da0,0);
          core::DescriptorKeyReference::operator=(&local_848,pvVar8);
          std::
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                     *)CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90));
          local_9a0 = core::DescriptorKeyReference::GetKeyType(&local_848);
          const::$_0::operator()::DescriptorKeyReference_const___const
                    (in_stack_ffffffffffffdeb8,in_stack_ffffffffffffdeb0);
          std::__cxx11::string::operator=(local_998,local_dc0);
          std::__cxx11::string::~string(local_dc0);
          if (in_RDI->key_type == kDescriptorKeyNull) {
            in_RDI->key_type = local_9a0;
            std::__cxx11::string::operator=((string *)&in_RDI->key,local_998);
          }
        }
        if (local_30 != 0) {
          std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
          push_back((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *
                    )CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90),
                    in_stack_ffffffffffffdd88);
        }
        DescriptorScriptData::~DescriptorScriptData
                  ((DescriptorScriptData *)
                   CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80));
        __gnu_cxx::
        __normal_iterator<cfd::core::DescriptorScriptReference_*,_std::vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>_>
        ::operator++(&local_858);
      }
      break;
    case 0x549c16:
      local_5b5 = 1;
      break;
    case 0x549c23:
      pvVar7 = std::
               vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ::operator[](&local_248,0);
      core::DescriptorScriptReference::GetKeyList(&local_dd8,pvVar7);
      pvVar8 = std::
               vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
               ::operator[](&local_dd8,0);
      core::DescriptorKeyReference::operator=(&local_848,pvVar8);
      std::
      vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 *)CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90));
      DVar6 = core::DescriptorKeyReference::GetKeyType(&local_848);
      in_RDI->key_type = DVar6;
      const::$_0::operator()::DescriptorKeyReference_const___const
                (in_stack_ffffffffffffdeb8,in_stack_ffffffffffffdeb0);
      std::__cxx11::string::operator=((string *)&in_RDI->key,local_df8);
      std::__cxx11::string::~string(local_df8);
      break;
    case 0x549d0d:
      pvVar7 = std::
               vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ::operator[](&local_248,0);
      core::DescriptorScriptReference::GetKeyList(&local_e10,pvVar7);
      std::
      vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ::operator=((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   *)CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90),
                  (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   *)in_stack_ffffffffffffdd88);
      std::
      vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 *)CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90));
      pvVar7 = std::
               vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
               ::operator[](&local_248,0);
      uVar2 = core::DescriptorScriptReference::GetReqNum(pvVar7);
      in_RDI->multisig_req_sig_num = uVar2;
      break;
    case 0x549d87:
    }
  }
  if ((local_5b5 & 1) != 0) {
    pvVar7 = std::
             vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
             ::operator[](&local_248,0);
    core::DescriptorScriptReference::DescriptorScriptReference(&local_1160,pvVar7);
    local_1161 = core::DescriptorScriptReference::HasChild(&local_1160);
    local_1168 = 0;
    if ((bool)local_1161) {
      core::Script::Script(&local_11a0);
    }
    else {
      core::DescriptorScriptReference::GetRedeemScript(&local_11a0,&local_1160);
    }
    core::Script::operator=(&in_RDI->redeem_script,&local_11a0);
    core::Script::~Script((Script *)CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80));
    while ((local_1161 & 1) != 0) {
      core::DescriptorScriptReference::DescriptorScriptReference(&local_14f0);
      DescriptorScriptData::DescriptorScriptData(in_stack_ffffffffffffddb0);
      DVar3 = core::DescriptorScriptReference::GetScriptType(&local_1160);
      if (DVar3 - kDescriptorScriptSh < 2) {
        bVar1 = core::DescriptorScriptReference::HasChild(&local_1160);
        if (bVar1) {
          core::DescriptorScriptReference::GetChild
                    ((DescriptorScriptReference *)(local_1bc8 + 0x18),&local_1160);
          core::DescriptorScriptReference::operator=
                    (&local_14f0,(DescriptorScriptReference *)(local_1bc8 + 0x18));
          core::DescriptorScriptReference::~DescriptorScriptReference
                    ((DescriptorScriptReference *)
                     CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80));
          DVar3 = core::DescriptorScriptReference::GetScriptType(&local_14f0);
          if ((DVar3 == kDescriptorScriptMulti) ||
             (DVar3 = core::DescriptorScriptReference::GetScriptType(&local_14f0),
             DVar3 == kDescriptorScriptSortedMulti)) {
            core::DescriptorScriptReference::GetKeyList
                      ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                        *)local_1bc8,&local_14f0);
            in_stack_ffffffffffffddb0 = (DescriptorScriptData *)local_1bc8;
            std::
            vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
            ::operator=((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                         *)CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90),
                        (vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                         *)in_stack_ffffffffffffdd88);
            std::
            vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
            ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                       *)CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90));
            local_5b4 = core::DescriptorScriptReference::GetReqNum(&local_14f0);
            in_RDI->multisig_req_sig_num = local_5b4;
            local_1161 = 0;
          }
          else {
            DVar3 = core::DescriptorScriptReference::GetScriptType(&local_14f0);
            if (DVar3 == kDescriptorScriptMiniscript) {
              local_1161 = 0;
            }
          }
          DVar3 = core::DescriptorScriptReference::GetScriptType(&local_14f0);
          if (DVar3 != kDescriptorScriptWpkh) {
            core::DescriptorScriptReference::GetRedeemScript
                      ((Script *)(local_1e20 + 0x220),&local_1160);
            core::Script::operator=(&in_RDI->redeem_script,(Script *)(local_1e20 + 0x220));
            core::Script::~Script
                      ((Script *)CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80));
          }
        }
        else {
          core::DescriptorScriptReference::GetRedeemScript(&local_1860,&local_1160);
          core::Script::operator=(&in_RDI->redeem_script,&local_1860);
          core::Script::~Script
                    ((Script *)CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80));
        }
      }
      else {
        local_1161 = 0;
      }
      local_1828 = core::DescriptorScriptReference::GetScriptType(&local_1160);
      local_17e8 = local_1168;
      core::DescriptorScriptReference::GetLockingScript((Script *)(local_1e20 + 0x1e8),&local_1160);
      core::Script::operator=(&local_1820,(Script *)(local_1e20 + 0x1e8));
      core::Script::~Script((Script *)CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80))
      ;
      core::DescriptorScriptReference::GenerateAddress
                ((Address *)(local_1e20 + 0x70),&local_1160,local_1c);
      core::Address::operator=(&local_17e0,(Address *)(local_1e20 + 0x70));
      core::Address::~Address
                ((Address *)CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80));
      local_1668 = core::DescriptorScriptReference::GetAddressType(&local_1160);
      bVar1 = core::DescriptorScriptReference::HasRedeemScript(&local_1160);
      if (bVar1) {
        core::DescriptorScriptReference::GetRedeemScript((Script *)(local_1e20 + 0x38),&local_1160);
        core::Script::operator=(&local_1660,(Script *)(local_1e20 + 0x38));
        core::Script::~Script
                  ((Script *)CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80));
      }
      bVar1 = core::DescriptorScriptReference::HasKey(&local_1160);
      if (bVar1) {
        core::DescriptorScriptReference::GetKeyList
                  ((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                    *)(local_1e20 + 0x20),&local_1160);
        pvVar8 = std::
                 vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                 ::operator[]((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                               *)(local_1e20 + 0x20),0);
        core::DescriptorKeyReference::operator=(&local_848,pvVar8);
        std::
        vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
        ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                   *)CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90));
        local_1628 = core::DescriptorKeyReference::GetKeyType(&local_848);
        const::$_0::operator()::DescriptorKeyReference_const___const
                  (in_stack_ffffffffffffdeb8,in_stack_ffffffffffffdeb0);
        in_stack_ffffffffffffdd88 = (value_type *)local_1e20;
        std::__cxx11::string::operator=(local_1620,(string *)in_stack_ffffffffffffdd88);
        std::__cxx11::string::~string((string *)in_stack_ffffffffffffdd88);
        in_stack_ffffffffffffdd94 = core::DescriptorKeyReference::GetKeyType(&local_848);
        in_RDI->key_type = in_stack_ffffffffffffdd94;
        const::$_0::operator()::DescriptorKeyReference_const___const
                  (in_stack_ffffffffffffdeb8,in_stack_ffffffffffffdeb0);
        std::__cxx11::string::operator=((string *)&in_RDI->key,local_1e40);
        std::__cxx11::string::~string(local_1e40);
      }
      else {
        local_1628 = kDescriptorKeyNull;
      }
      local_1600 = local_5b4;
      if (local_30 != 0) {
        std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::
        push_back((vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)
                  CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90),
                  in_stack_ffffffffffffdd88);
      }
      if ((local_1161 & 1) == 0) {
LAB_0054a541:
        local_1161 = 0;
      }
      else {
        bVar1 = core::DescriptorScriptReference::HasChild(&local_1160);
        in_stack_ffffffffffffdd84 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffdd84);
        if (!bVar1) goto LAB_0054a541;
        core::DescriptorScriptReference::GetChild
                  ((DescriptorScriptReference *)&stack0xffffffffffffde70,&local_1160);
        core::DescriptorScriptReference::operator=
                  (&local_14f0,(DescriptorScriptReference *)&stack0xffffffffffffde70);
        core::DescriptorScriptReference::~DescriptorScriptReference
                  ((DescriptorScriptReference *)
                   CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80));
        core::DescriptorScriptReference::operator=(&local_1160,&local_14f0);
        local_1168 = local_1168 + 1;
      }
      DescriptorScriptData::~DescriptorScriptData
                ((DescriptorScriptData *)
                 CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80));
      core::DescriptorScriptReference::~DescriptorScriptReference
                ((DescriptorScriptReference *)
                 CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80));
    }
    core::DescriptorScriptReference::~DescriptorScriptReference
              ((DescriptorScriptReference *)
               CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80));
  }
  bVar1 = std::
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          ::empty(&local_5b0);
  if ((!bVar1) && (in_stack_00000008 != 0)) {
    local_2198 = &local_5b0;
    local_21a0._M_current =
         (DescriptorKeyReference *)
         std::
         vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
         ::begin(local_2198);
    local_21a8._M_current =
         (DescriptorKeyReference *)
         std::
         vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
         ::end(local_2198);
    while (bVar1 = __gnu_cxx::operator!=(&local_21a0,&local_21a8), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<cfd::core::DescriptorKeyReference_*,_std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>_>
                ::operator*(&local_21a0);
      in_stack_ffffffffffffdd80 = core::DescriptorKeyReference::GetKeyType(this_00);
      const::$_0::operator()::DescriptorKeyReference_const___const
                (in_stack_ffffffffffffdeb8,in_stack_ffffffffffffdeb0);
      std::vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_>::push_back
                ((vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *)
                 CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90),
                 (value_type *)in_stack_ffffffffffffdd88);
      DescriptorKeyData::~DescriptorKeyData((DescriptorKeyData *)0x54a6a1);
      __gnu_cxx::
      __normal_iterator<cfd::core::DescriptorKeyReference_*,_std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>_>
      ::operator++(&local_21a0);
    }
  }
  local_6d = 1;
  core::DescriptorKeyReference::~DescriptorKeyReference
            ((DescriptorKeyReference *)CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80)
            );
  std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ::~vector((vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             *)CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90));
  core::DescriptorNode::~DescriptorNode
            ((DescriptorNode *)CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80));
  std::
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ::~vector(&local_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90));
  core::Descriptor::~Descriptor((Descriptor *)0x54a72e);
  if ((local_6d & 1) == 0) {
    DescriptorScriptData::~DescriptorScriptData
              ((DescriptorScriptData *)CONCAT44(in_stack_ffffffffffffdd84,in_stack_ffffffffffffdd80)
              );
  }
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT44(in_stack_ffffffffffffdd94,in_stack_ffffffffffffdd90));
  return this_01;
}

Assistant:

DescriptorScriptData AddressApi::ParseOutputDescriptor(
    const std::string& descriptor, NetType net_type,
    const std::string& bip32_derivation_path,
    std::vector<DescriptorScriptData>* script_list,
    std::vector<DescriptorKeyData>* multisig_key_list,
    const std::vector<AddressFormatData>* prefix_list,
    std::vector<KeyData>* key_list) const {
  std::vector<AddressFormatData> addr_prefixes;
  if (prefix_list == nullptr) {
    addr_prefixes = cfd::core::GetBitcoinAddressFormatList();
  } else {
    addr_prefixes = *prefix_list;
  }
  if (script_list != nullptr) script_list->clear();
  if (multisig_key_list != nullptr) multisig_key_list->clear();

  static auto get_keystr_function =
      [](const DescriptorKeyReference& key_ref) -> std::string {
    if (key_ref.HasExtPrivkey()) {
      return key_ref.GetExtPrivkey().ToString();
    } else if (key_ref.HasExtPubkey()) {
      return key_ref.GetExtPubkey().ToString();
    } else {
      return key_ref.GetPubkey().GetHex();
    }
  };

  DescriptorScriptData result;
  result.key_type = DescriptorKeyType::kDescriptorKeyNull;  // dummy init
  result.address_type = AddressType::kP2shAddress;          // dummy init
  result.multisig_req_sig_num = 0;
  Descriptor desc = Descriptor::Parse(descriptor, &addr_prefixes);
  std::vector<std::string> args;
  for (uint32_t index = 0; index < desc.GetNeedArgumentNum(); ++index) {
    args.push_back(bip32_derivation_path);
  }
  if (key_list != nullptr) {
    auto temp_list = desc.GetKeyDataAll(&args);
    for (const auto& key : temp_list) {
      key_list->push_back(key);
    }
  }
  std::vector<DescriptorScriptReference> script_refs =
      desc.GetReferenceAll(&args);
  DescriptorNode node = desc.GetNode();

  result.type = node.GetScriptType();
  result.key_type = DescriptorKeyType::kDescriptorKeyNull;
  result.depth = 0;
  result.locking_script = script_refs[0].GetLockingScript();
  if (script_refs[0].HasAddress()) {
    result.address = script_refs[0].GenerateAddress(net_type);
    result.address_type = script_refs[0].GetAddressType();
  }
  if (script_refs[0].HasRedeemScript()) {
    result.redeem_script = script_refs[0].GetRedeemScript();
  }

  std::vector<DescriptorKeyReference> multisig_keys;
  uint32_t multisig_req_num = 0;
  bool use_script_list = false;
  DescriptorKeyReference key_ref;
  switch (result.type) {
    case DescriptorScriptType::kDescriptorScriptCombo:
      for (const auto& ref : script_refs) {
        DescriptorScriptData ref_data;
        ref_data.type = ref.GetScriptType();
        ref_data.depth = 0;
        ref_data.locking_script = ref.GetLockingScript();
        if (ref.HasAddress()) {
          ref_data.address = ref.GenerateAddress(net_type);
          ref_data.address_type = ref.GetAddressType();
        } else {
          ref_data.address_type = AddressType::kP2shAddress;  // dummy init
        }
        if (ref.HasRedeemScript()) {
          ref_data.redeem_script = ref.GetRedeemScript();
          ref_data.key_type = DescriptorKeyType::kDescriptorKeyNull;
        } else {
          key_ref = ref.GetKeyList()[0];
          ref_data.key_type = key_ref.GetKeyType();
          ref_data.key = get_keystr_function(key_ref);
          if (result.key_type == DescriptorKeyType::kDescriptorKeyNull) {
            result.key_type = ref_data.key_type;
            result.key = ref_data.key;
          }
        }
        if (script_list != nullptr) script_list->push_back(ref_data);
      }
      break;
    case DescriptorScriptType::kDescriptorScriptSh:
    case DescriptorScriptType::kDescriptorScriptWsh:
      use_script_list = true;
      break;
    case DescriptorScriptType::kDescriptorScriptPk:
    case DescriptorScriptType::kDescriptorScriptPkh:
    case DescriptorScriptType::kDescriptorScriptWpkh:
      key_ref = script_refs[0].GetKeyList()[0];
      result.key_type = key_ref.GetKeyType();
      result.key = get_keystr_function(key_ref);
      break;
    case DescriptorScriptType::kDescriptorScriptMulti:
    case DescriptorScriptType::kDescriptorScriptSortedMulti:
      multisig_keys = script_refs[0].GetKeyList();
      result.multisig_req_sig_num = script_refs[0].GetReqNum();
      break;
    case DescriptorScriptType::kDescriptorScriptRaw:
    case DescriptorScriptType::kDescriptorScriptAddr:
    default:
      break;
  }

  if (use_script_list) {
    DescriptorScriptReference script_ref = script_refs[0];
    bool is_loop = script_ref.HasChild();
    uint32_t depth = 0;
    result.redeem_script = (is_loop) ? Script() : script_ref.GetRedeemScript();
    while (is_loop) {
      DescriptorScriptReference child;
      DescriptorScriptData data;
      switch (script_ref.GetScriptType()) {
        case DescriptorScriptType::kDescriptorScriptSh:
        case DescriptorScriptType::kDescriptorScriptWsh:
          if (!script_ref.HasChild()) {
            result.redeem_script = script_ref.GetRedeemScript();
          } else {
            child = script_ref.GetChild();
            if ((child.GetScriptType() ==
                 DescriptorScriptType::kDescriptorScriptMulti) ||
                (child.GetScriptType() ==
                 DescriptorScriptType::kDescriptorScriptSortedMulti)) {
              multisig_keys = child.GetKeyList();
              multisig_req_num = child.GetReqNum();
              result.multisig_req_sig_num = multisig_req_num;
              is_loop = false;
            } else if (
                child.GetScriptType() ==
                DescriptorScriptType::kDescriptorScriptMiniscript) {
              is_loop = false;
            }
            if (child.GetScriptType() !=
                DescriptorScriptType::kDescriptorScriptWpkh) {
              result.redeem_script = script_ref.GetRedeemScript();
            }
          }
          break;
        // case DescriptorScriptType::kDescriptorScriptPk:
        // case DescriptorScriptType::kDescriptorScriptPkh:
        // case DescriptorScriptType::kDescriptorScriptWpkh:
        default:
          is_loop = false;
          break;
      }
      data.type = script_ref.GetScriptType();
      data.depth = depth;
      data.locking_script = script_ref.GetLockingScript();
      data.address = script_ref.GenerateAddress(net_type);
      data.address_type = script_ref.GetAddressType();
      if (script_ref.HasRedeemScript()) {
        data.redeem_script = script_ref.GetRedeemScript();
      }
      if (script_ref.HasKey()) {
        key_ref = script_ref.GetKeyList()[0];
        data.key_type = key_ref.GetKeyType();
        data.key = get_keystr_function(key_ref);
        result.key_type = key_ref.GetKeyType();
        result.key = get_keystr_function(key_ref);
      } else {
        data.key_type = DescriptorKeyType::kDescriptorKeyNull;
      }
      data.multisig_req_sig_num = multisig_req_num;

      if (script_list != nullptr) script_list->push_back(data);
      if (is_loop && script_ref.HasChild()) {
        child = script_ref.GetChild();
        script_ref = child;
        ++depth;
      } else {
        is_loop = false;
      }
    }
  }

  if ((!multisig_keys.empty()) && multisig_key_list) {
    for (const auto& ref : multisig_keys) {
      DescriptorKeyData key_data{ref.GetKeyType(), get_keystr_function(ref)};
      multisig_key_list->push_back(key_data);
    }
  }
  return result;
}